

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompression.hpp
# Opt level: O1

void __thiscall
duckdb::CompressedStringScanState::CompressedStringScanState
          (CompressedStringScanState *this,BufferHandle *handle_p)

{
  (this->super_StringScanState).super_SegmentScanState._vptr_SegmentScanState = (_func_int **)0x0;
  (this->super_StringScanState).handle.handle.internal.
  super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->super_StringScanState).handle.handle.internal.
  super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_StringScanState).handle.node.ptr = (FileBuffer *)0x0;
  (this->super_StringScanState).super_SegmentScanState._vptr_SegmentScanState =
       (_func_int **)&PTR__StringScanState_02486770;
  BufferHandle::BufferHandle(&(this->super_StringScanState).handle);
  (this->super_StringScanState).super_SegmentScanState._vptr_SegmentScanState =
       (_func_int **)&PTR__CompressedStringScanState_02486720;
  BufferHandle::BufferHandle(&this->owned_handle);
  (this->handle).ptr = handle_p;
  (this->dictionary).internal.super___shared_ptr<duckdb::Vector,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  (this->dictionary).internal.super___shared_ptr<duckdb::Vector,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->sel_vec).internal.super___shared_ptr<duckdb::SelectionVector,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->sel_vec).internal.super___shared_ptr<duckdb::SelectionVector,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->sel_vec_size = 0;
  return;
}

Assistant:

explicit CompressedStringScanState(BufferHandle &handle_p) : StringScanState(), owned_handle(), handle(handle_p) {
	}